

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O2

void ihevc_sao_edge_offset_class0
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  UWORD8 *pUVar11;
  byte abStack_b9 [57];
  UWORD8 au1_mask [64];
  UWORD8 au1_src_left_tmp [64];
  
  abStack_b9[1] = 0xff;
  abStack_b9[2] = 0xff;
  abStack_b9[3] = 0xff;
  abStack_b9[4] = 0xff;
  abStack_b9[5] = 0xff;
  abStack_b9[6] = 0xff;
  abStack_b9[7] = 0xff;
  abStack_b9[8] = 0xff;
  abStack_b9[9] = 0xff;
  abStack_b9[10] = 0xff;
  abStack_b9[0xb] = 0xff;
  abStack_b9[0xc] = 0xff;
  abStack_b9[0xd] = 0xff;
  abStack_b9[0xe] = 0xff;
  abStack_b9[0xf] = 0xff;
  abStack_b9[0x10] = 0xff;
  abStack_b9[0x11] = 0xff;
  abStack_b9[0x12] = 0xff;
  abStack_b9[0x13] = 0xff;
  abStack_b9[0x14] = 0xff;
  abStack_b9[0x15] = 0xff;
  abStack_b9[0x16] = 0xff;
  abStack_b9[0x17] = 0xff;
  abStack_b9[0x18] = 0xff;
  abStack_b9[0x19] = 0xff;
  abStack_b9[0x1a] = 0xff;
  abStack_b9[0x1b] = 0xff;
  abStack_b9[0x1c] = 0xff;
  abStack_b9[0x1d] = 0xff;
  abStack_b9[0x1e] = 0xff;
  abStack_b9[0x1f] = 0xff;
  abStack_b9[0x20] = 0xff;
  abStack_b9[0x21] = 0xff;
  abStack_b9[0x22] = 0xff;
  abStack_b9[0x23] = 0xff;
  abStack_b9[0x24] = 0xff;
  abStack_b9[0x25] = 0xff;
  abStack_b9[0x26] = 0xff;
  abStack_b9[0x27] = 0xff;
  abStack_b9[0x28] = 0xff;
  abStack_b9[0x29] = 0xff;
  abStack_b9[0x2a] = 0xff;
  abStack_b9[0x2b] = 0xff;
  abStack_b9[0x2c] = 0xff;
  abStack_b9[0x2d] = 0xff;
  abStack_b9[0x2e] = 0xff;
  abStack_b9[0x2f] = 0xff;
  abStack_b9[0x30] = 0xff;
  abStack_b9[0x31] = 0xff;
  abStack_b9[0x32] = 0xff;
  abStack_b9[0x33] = 0xff;
  abStack_b9[0x34] = 0xff;
  abStack_b9[0x35] = 0xff;
  abStack_b9[0x36] = 0xff;
  abStack_b9[0x37] = 0xff;
  abStack_b9[0x38] = 0xff;
  au1_mask[0] = 0xff;
  au1_mask[1] = 0xff;
  au1_mask[2] = 0xff;
  au1_mask[3] = 0xff;
  au1_mask[4] = 0xff;
  au1_mask[5] = 0xff;
  au1_mask[6] = 0xff;
  au1_mask[7] = 0xff;
  lVar3 = (long)wd;
  *pu1_src_top_left = pu1_src_top[lVar3 + -1];
  uVar7 = 0;
  uVar2 = 0;
  if (0 < ht) {
    uVar2 = (ulong)(uint)ht;
  }
  pUVar11 = pu1_src + lVar3 + -1;
  for (; uVar2 != uVar7; uVar7 = uVar7 + 1) {
    au1_mask[uVar7 + 8] = *pUVar11;
    pUVar11 = pUVar11 + src_strd;
  }
  uVar8 = 0;
  uVar7 = (ulong)(uint)wd;
  if (wd < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    pu1_src_top[uVar8] = pu1_src[uVar8 + (long)((ht + -1) * src_strd)];
  }
  if (*pu1_avail == '\0') {
    abStack_b9[1] = 0;
    abStack_b9[2] = 0xff;
    abStack_b9[3] = 0xff;
    abStack_b9[4] = 0xff;
  }
  if (pu1_avail[1] == '\0') {
    abStack_b9[lVar3] = 0;
  }
  for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
    bVar9 = *pu1_src;
    uVar6 = (uint)(bVar9 != pu1_src_left[uVar8]);
    if (bVar9 < pu1_src_left[uVar8]) {
      uVar6 = 0xffffffff;
    }
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      bVar1 = pu1_src[uVar4 + 1];
      uVar5 = (uint)(bVar9 != bVar1);
      if (bVar9 < bVar1) {
        uVar5 = 0xffffffff;
      }
      if (((uint)abStack_b9[uVar4 + 1] & gi4_ihevc_table_edge_idx[uVar6 + uVar5 + 2]) != 0) {
        iVar10 = (int)pi1_sao_offset
                      [(uint)abStack_b9[uVar4 + 1] & gi4_ihevc_table_edge_idx[uVar6 + uVar5 + 2]] +
                 (uint)bVar9;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        pu1_src[uVar4] = (byte)iVar10;
      }
      uVar6 = -uVar5;
      bVar9 = bVar1;
    }
    pu1_src = pu1_src + src_strd;
  }
  for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
    pu1_src_left[uVar7] = au1_mask[uVar7 + 8];
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class0(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE];
    WORD8 u1_sign_left, u1_sign_right;
    WORD32 bit_depth;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);
    bit_depth = BIT_DEPTH_LUMA;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update top and top-left arrays */
    *pu1_src_top_left = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }

    /* Update masks based on the availability flags */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            u1_sign_left = SIGN(pu1_src[0] - pu1_src_left[row]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_right = SIGN(pu1_src[col] - pu1_src[col + 1]);
                edge_idx = 2 + u1_sign_left + u1_sign_right;
                u1_sign_left = -u1_sign_right;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }
    }

    /* Update left array */
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }

}